

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::setupShaderData(ShaderOperatorCase *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference this_00;
  ShaderType shaderType_00;
  uint uVar8;
  int precision_00;
  float w_;
  float w__00;
  float y_;
  char *local_618;
  Precision local_5a4;
  Precision local_5a0;
  ostream *local_598;
  char *local_590;
  Vector<float,_4> local_580;
  Vector<float,_4> local_570;
  Vector<float,_4> local_560;
  Vector<float,_4> local_550;
  undefined1 local_540 [8];
  Vec4 row;
  int rowNdx;
  Mat4 attribMatrix;
  float maxBias;
  float minBias;
  float scale;
  float rangeMax;
  float rangeMin;
  ShaderValue *v;
  string local_4c8 [4];
  int inputNdx;
  string local_4a8 [32];
  int local_488;
  allocator<char> local_481;
  int i_4;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  string local_3d8;
  float local_3b8;
  float local_3b4;
  float resultBias;
  float resultScale;
  int outScalarSize;
  bool isResFloatVec;
  bool isBoolOut;
  char *outTypeName;
  char *swizzle;
  char *typeName;
  int local_388;
  bool isBool;
  bool isUint;
  DataType DStack_384;
  bool isInt;
  int inSize;
  DataType inType;
  int i_3;
  string prefix;
  int local_350;
  int i_2;
  int i_1;
  Precision prec;
  bool isUintVal;
  bool isIntVal;
  bool isBoolVal;
  int i;
  ostringstream *op;
  undefined1 local_328 [8];
  ostringstream frag;
  ostringstream vtx;
  char *inputPrecision [3];
  char *precision;
  ShaderType shaderType;
  ShaderOperatorCase *this_local;
  
  shaderType_00 = (ShaderType)(((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0);
  if ((this->m_spec).precision == PRECISION_LAST) {
    local_590 = (char *)0x0;
  }
  else {
    local_590 = glu::getPrecisionName((this->m_spec).precision);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_598 = (ostream *)local_328;
  }
  else {
    local_598 = (ostream *)&frag.field_0x170;
  }
  std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  std::operator<<((ostream *)local_328,"#version 300 es\n");
  for (prec = PRECISION_LOWP; (int)prec < (this->m_spec).numInputs; prec = prec + PRECISION_MEDIUMP)
  {
    bVar1 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x23,0x26);
    bVar2 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x1b,0x1e);
    bVar3 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x1f,0x22);
    if (bVar1) {
      local_5a0 = PRECISION_MEDIUMP;
    }
    else {
      if ((bVar2) || (bVar3)) {
        local_5a4 = PRECISION_HIGHP;
      }
      else {
        local_5a4 = (this->m_spec).precision;
      }
      local_5a0 = local_5a4;
    }
    pcVar6 = glu::getPrecisionName(local_5a0);
    inputPrecision[(long)(int)prec + -1] = pcVar6;
  }
  std::operator<<((ostream *)&frag.field_0x170,"in highp vec4 a_position;\n");
  for (local_350 = 0; local_350 < (this->m_spec).numInputs; local_350 = local_350 + 1) {
    poVar7 = std::operator<<((ostream *)&frag.field_0x170,"in ");
    poVar7 = std::operator<<(poVar7,inputPrecision[(long)local_350 + -1]);
    poVar7 = std::operator<<(poVar7," vec4 a_in");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_350);
    std::operator<<(poVar7,";\n");
  }
  std::operator<<((ostream *)local_328,"layout(location = 0) out mediump vec4 o_color;\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    for (prefix.field_2._12_4_ = 0; (int)prefix.field_2._12_4_ < (this->m_spec).numInputs;
        prefix.field_2._12_4_ = prefix.field_2._12_4_ + 1) {
      poVar7 = std::operator<<((ostream *)&frag.field_0x170,"out ");
      poVar7 = std::operator<<(poVar7,inputPrecision[(long)(int)prefix.field_2._12_4_ + -1]);
      poVar7 = std::operator<<(poVar7," vec4 v_in");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,prefix.field_2._12_4_);
      std::operator<<(poVar7,";\n");
      poVar7 = std::operator<<((ostream *)local_328,"in ");
      poVar7 = std::operator<<(poVar7,inputPrecision[(long)(int)prefix.field_2._12_4_ + -1]);
      poVar7 = std::operator<<(poVar7," vec4 v_in");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,prefix.field_2._12_4_);
      std::operator<<(poVar7,";\n");
    }
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_328,"in mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_328,"\n");
  std::operator<<((ostream *)local_328,"void main()\n");
  std::operator<<((ostream *)local_328,"{\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_618 = "v_";
  }
  else {
    local_618 = "a_";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_3,local_618,(allocator<char> *)((long)&inType + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&inType + 3));
  for (inSize = 0; inSize < (this->m_spec).numInputs; inSize = inSize + 1) {
    DStack_384 = (this->m_spec).inputs[inSize].type;
    local_388 = glu::getDataTypeScalarSize(DStack_384);
    typeName._7_1_ = de::inRange<int>(DStack_384,0x1b,0x1e);
    typeName._6_1_ = de::inRange<int>(DStack_384,0x1f,0x22);
    typeName._5_1_ = de::inRange<int>(DStack_384,0x23,0x26);
    swizzle = glu::getDataTypeName(DStack_384);
    outTypeName = *(char **)(s_inSwizzles + (long)(local_388 + -1) * 8 + (long)inSize * 0x20);
    std::operator<<(local_598,"\t");
    if ((local_590 != (char *)0x0) && ((typeName._5_1_ & 1) == 0)) {
      poVar7 = std::operator<<(local_598,local_590);
      std::operator<<(poVar7," ");
    }
    poVar7 = std::operator<<(local_598,swizzle);
    poVar7 = std::operator<<(poVar7," in");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,inSize);
    std::operator<<(poVar7," = ");
    if ((typeName._5_1_ & 1) == 0) {
      if (((typeName._7_1_ & 1) != 0) || ((typeName._6_1_ & 1) != 0)) {
        poVar7 = std::operator<<(local_598,swizzle);
        std::operator<<(poVar7,"(");
      }
    }
    else if (local_388 == 1) {
      std::operator<<(local_598,"(");
    }
    else {
      std::operator<<(local_598,"greaterThan(");
    }
    poVar7 = std::operator<<(local_598,(string *)&i_3);
    poVar7 = std::operator<<(poVar7,"in");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,inSize);
    poVar7 = std::operator<<(poVar7,".");
    std::operator<<(poVar7,outTypeName);
    if ((typeName._5_1_ & 1) == 0) {
      if (((typeName._7_1_ & 1) != 0) || ((typeName._6_1_ & 1) != 0)) {
        std::operator<<(local_598,")");
      }
    }
    else if (local_388 == 1) {
      std::operator<<(local_598," > 0.0)");
    }
    else {
      poVar7 = std::operator<<(local_598,", vec");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_388);
      std::operator<<(poVar7,"(0.0))");
    }
    std::operator<<(local_598,";\n");
  }
  _outScalarSize = glu::getDataTypeName((this->m_spec).output);
  resultScale._3_1_ = de::inRange<int>((this->m_spec).output,0x23,0x26);
  std::operator<<(local_598,"\t");
  if ((local_590 != (char *)0x0) && ((resultScale._3_1_ & 1) == 0)) {
    poVar7 = std::operator<<(local_598,local_590);
    std::operator<<(poVar7," ");
  }
  poVar7 = std::operator<<(local_598,_outScalarSize);
  poVar7 = std::operator<<(poVar7," res = ");
  poVar7 = std::operator<<(poVar7,_outScalarSize);
  std::operator<<(poVar7,"(0.0);\n\n");
  poVar7 = std::operator<<(local_598,"\t");
  poVar7 = std::operator<<(poVar7,(string *)&this->m_shaderOp);
  std::operator<<(poVar7,"\n\n");
  resultScale._2_1_ = de::inRange<int>((this->m_spec).output,1,4);
  resultBias = (float)glu::getDataTypeScalarSize((this->m_spec).output);
  std::operator<<(local_598,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n");
  poVar7 = std::operator<<(local_598,"\tcolor.");
  poVar7 = std::operator<<(poVar7,*(char **)(s_outSwizzles + (long)((int)resultBias + -1) * 8));
  std::operator<<(poVar7," = ");
  if (((resultScale._2_1_ & 1) == 0) && (resultBias == 1.4013e-45)) {
    std::operator<<(local_598,"float(res)");
  }
  else if ((resultScale._2_1_ & 1) == 0) {
    poVar7 = std::operator<<(local_598,"vec");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)resultBias);
    std::operator<<(poVar7,"(res)");
  }
  else {
    std::operator<<(local_598,"res");
  }
  std::operator<<(local_598,";\n");
  iVar4 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_3b4 = FloatScalar::getValue
                        (&(this->m_spec).resultScale,(Functions *)CONCAT44(extraout_var,iVar4),
                         shaderType_00);
  iVar4 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_3b8 = FloatScalar::getValue
                        (&(this->m_spec).resultBias,(Functions *)CONCAT44(extraout_var_00,iVar4),
                         shaderType_00);
  if ((((local_3b4 != 1.0) || (NAN(local_3b4))) || (local_3b8 != 0.0)) || (NAN(local_3b8))) {
    std::operator<<(local_598,"\tcolor = color");
    if ((local_3b4 != 1.0) || (NAN(local_3b4))) {
      poVar7 = std::operator<<(local_598," * ");
      de::toString<float>(&local_3f8,&local_3b4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"1.0",&local_419);
      twoValuedVec4(&local_3d8,&local_3f8,&local_418,
                    (BVec4 *)(s_outSwizzleChannelMasks + (long)((int)resultBias + -1) * 4));
      std::operator<<(poVar7,(string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
    if ((local_3b8 != 0.0) || (NAN(local_3b8))) {
      poVar7 = std::operator<<(local_598," + ");
      de::floatToString_abi_cxx11_(&local_460,(de *)0x2,local_3b8,precision_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i_4,"0.0",&local_481);
      twoValuedVec4(&local_440,&local_460,(string *)&i_4,
                    (BVec4 *)(s_outSwizzleChannelMasks + (long)((int)resultBias + -1) * 4));
      std::operator<<(poVar7,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&i_4);
      std::allocator<char>::~allocator(&local_481);
      std::__cxx11::string::~string((string *)&local_460);
    }
    std::operator<<(local_598,";\n");
  }
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    for (local_488 = 0; local_488 < (this->m_spec).numInputs; local_488 = local_488 + 1) {
      poVar7 = std::operator<<((ostream *)&frag.field_0x170,"\tv_in");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_488);
      poVar7 = std::operator<<(poVar7," = a_in");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_488);
      std::operator<<(poVar7,";\n");
    }
    std::operator<<((ostream *)local_328,"\to_color = color;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = color;\n");
    std::operator<<((ostream *)local_328,"\to_color = v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_328,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_4a8);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_4c8);
  std::__cxx11::string::~string(local_4c8);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)(this->m_spec).numInputs);
  for (v._4_4_ = 0; v._4_4_ < (this->m_spec).numInputs; v._4_4_ = v._4_4_ + 1) {
    iVar4 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    w_ = FloatScalar::getValue
                   (&(this->m_spec).inputs[v._4_4_].rangeMin,
                    (Functions *)CONCAT44(extraout_var_01,iVar4),shaderType_00);
    iVar4 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    w__00 = FloatScalar::getValue
                      (&(this->m_spec).inputs[v._4_4_].rangeMax,
                       (Functions *)CONCAT44(extraout_var_02,iVar4),shaderType_00);
    y_ = w__00 - w_;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(row.m_data + 3));
    for (row.m_data[2] = 0.0; (int)row.m_data[2] < 4;
        row.m_data[2] = (float)((int)row.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_540);
      uVar5 = (int)row.m_data[2] + v._4_4_;
      uVar8 = uVar5;
      if ((int)uVar5 < 0) {
        uVar8 = (int)row.m_data[2] + 3 + v._4_4_;
      }
      switch(uVar5 - (uVar8 & 0xfffffffc)) {
      case 0:
        tcu::Vector<float,_4>::Vector(&local_550,y_,0.0,0.0,w_);
        local_540._0_4_ = local_550.m_data[0];
        local_540._4_4_ = local_550.m_data[1];
        row.m_data[0] = local_550.m_data[2];
        row.m_data[1] = local_550.m_data[3];
        break;
      case 1:
        tcu::Vector<float,_4>::Vector(&local_560,0.0,y_,0.0,w_);
        local_540._0_4_ = local_560.m_data[0];
        local_540._4_4_ = local_560.m_data[1];
        row.m_data[0] = local_560.m_data[2];
        row.m_data[1] = local_560.m_data[3];
        break;
      case 2:
        tcu::Vector<float,_4>::Vector(&local_570,-y_,0.0,0.0,w__00);
        local_540._0_4_ = local_570.m_data[0];
        local_540._4_4_ = local_570.m_data[1];
        row.m_data[0] = local_570.m_data[2];
        row.m_data[1] = local_570.m_data[3];
        break;
      case 3:
        tcu::Vector<float,_4>::Vector(&local_580,0.0,-y_,0.0,w__00);
        local_540._0_4_ = local_580.m_data[0];
        local_540._4_4_ = local_580.m_data[1];
        row.m_data[0] = local_580.m_data[2];
        row.m_data[1] = local_580.m_data[3];
      }
      tcu::Matrix<float,_4,_4>::setRow
                ((Matrix<float,_4,_4> *)(row.m_data + 3),(int)row.m_data[2],
                 (Vector<float,_4> *)local_540);
    }
    this_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)v._4_4_);
    tcu::Matrix<float,_4,_4>::operator=(this_00,(Matrix<float,_4,_4> *)(row.m_data + 3));
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(row.m_data + 3));
  }
  std::__cxx11::string::~string((string *)&i_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return;
}

Assistant:

void ShaderOperatorCase::setupShaderData (void)
{
	ShaderType		shaderType	= m_isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT;
	const char*		precision	= m_spec.precision != PRECISION_LAST ? getPrecisionName(m_spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= m_isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	// Compute precision for inputs.
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		bool		isUintVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_UINT, TYPE_UINT_VEC4);
		// \note Mediump interpolators are used for booleans, and highp for integers.
		Precision	prec		= isBoolVal	? PRECISION_MEDIUMP
								: isIntVal || isUintVal ? PRECISION_HIGHP
								: m_spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "in " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	// Color output.
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		{
			vtx << "out " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = m_isVertexCase ? "a_" : "v_";
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		DataType		inType		= m_spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isUint		= de::inRange<int>(inType, TYPE_UINT, TYPE_UINT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt || isUint)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt || isUint)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(m_spec.output);
		bool		isBoolOut	= de::inRange<int>(m_spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << m_shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(m_spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(m_spec.output);

	op << "\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= m_spec.resultScale.getValue(m_renderCtx.getFunctions(), shaderType);
	float	resultBias		= m_spec.resultBias.getValue(m_renderCtx.getFunctions(), shaderType);
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << twoValuedVec4(de::toString(resultScale),		"1.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		if (resultBias != 0.0f)  op << " + " << twoValuedVec4(de::floatToString(resultBias, 2),	"0.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		op << ";\n";
	}

	// ..
	if (m_isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	o_color = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(m_spec.numInputs);
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = m_spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float rangeMin	= v.rangeMin.getValue(m_renderCtx.getFunctions(), shaderType);
		float rangeMax	= v.rangeMax.getValue(m_renderCtx.getFunctions(), shaderType);
		float scale		= rangeMax - rangeMin;
		float minBias	= rangeMin;
		float maxBias	= rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}